

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

void __thiscall
ON_MeshNgonIterator::ON_MeshNgonIterator(ON_MeshNgonIterator *this,ON_MeshNgonIterator *src)

{
  ON_COMPONENT_INDEX ci;
  uint *puVar1;
  uint uVar2;
  ON_MeshNgon *pOVar3;
  
  puVar1 = src->m_facedex_to_ngondex_map;
  this->m_mesh = src->m_mesh;
  this->m_facedex_to_ngondex_map = puVar1;
  this->m_current_ngon = 0;
  ON_MeshNgonBuffer::ON_MeshNgonBuffer(&this->m_ngon_buffer);
  ci = src->m_current_ngon_ci;
  this->m_current_ngon_ci = ci;
  uVar2 = src->m_mesh_ngon_count;
  this->m_mesh_face_count = src->m_mesh_face_count;
  this->m_mesh_ngon_count = uVar2;
  this->m_iterator_index = src->m_iterator_index;
  if (((ci.m_type & ~brep_vertex) == mesh_face) && (this->m_mesh != (ON_Mesh *)0x0)) {
    pOVar3 = ON_Mesh::NgonFromComponentIndex(this->m_mesh,&this->m_ngon_buffer,ci);
    this->m_current_ngon = (ON__UINT_PTR)pOVar3;
  }
  return;
}

Assistant:

ON_MeshNgonIterator::ON_MeshNgonIterator(
  const ON_MeshNgonIterator& src
  )
  : m_mesh(src.m_mesh)
  , m_facedex_to_ngondex_map(src.m_facedex_to_ngondex_map)
  , m_current_ngon_ci(src.m_current_ngon_ci)
  , m_mesh_face_count(src.m_mesh_face_count)
  , m_mesh_ngon_count(src.m_mesh_ngon_count)
  , m_iterator_index(src.m_iterator_index)
{
  if (    ON_COMPONENT_INDEX::mesh_face == m_current_ngon_ci.m_type 
       || ON_COMPONENT_INDEX::mesh_ngon == m_current_ngon_ci.m_type 
     )
  {
    if ( 0 != m_mesh )
      m_current_ngon = (ON__UINT_PTR)(m_mesh->NgonFromComponentIndex(m_ngon_buffer,m_current_ngon_ci));
  }
}